

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O2

IceTCommRequest create_request(void)

{
  IceTCommRequest icet_request;
  void *pvVar1;
  int line;
  
  icet_request = (IceTCommRequest)malloc(0x10);
  if (icet_request == (IceTCommRequest)0x0) {
    line = 0x83;
  }
  else {
    icet_request->magic_number = 0xd7168b00;
    pvVar1 = malloc(8);
    icet_request->internals = pvVar1;
    if (pvVar1 != (void *)0x0) {
      setMPIRequest(icet_request,(MPI_Request)&ompi_request_null);
      return icet_request;
    }
    free(icet_request);
    line = 0x8c;
  }
  icetRaiseDiagnostic("Could not allocate memory for IceTCommRequest",0xfffffffc,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                      ,line);
  return (IceTCommRequest)0x0;
}

Assistant:

static IceTCommRequest create_request(void)
{
    IceTCommRequest request;

    request = (IceTCommRequest)malloc(sizeof(struct IceTCommRequestStruct));
    if (request == NULL) {
        icetRaiseError("Could not allocate memory for IceTCommRequest",
                       ICET_OUT_OF_MEMORY);
        return NULL;
    }

    request->magic_number = ICET_MPI_REQUEST_MAGIC_NUMBER;
    request->internals=malloc(sizeof(struct IceTMPICommRequestInternalsStruct));
    if (request->internals == NULL) {
        free(request);
        icetRaiseError("Could not allocate memory for IceTCommRequest",
                       ICET_OUT_OF_MEMORY);
        return NULL;
    }

    setMPIRequest(request, MPI_REQUEST_NULL);

    return request;
}